

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CodeGeneratorRequest::~CodeGeneratorRequest(CodeGeneratorRequest *this)

{
  RepeatedPtrField<google::protobuf::FileDescriptorProto> *in_RDI;
  CodeGeneratorRequest *unaff_retaddr;
  
  (in_RDI->super_RepeatedPtrFieldBase).arena_ = (Arena *)&PTR__CodeGeneratorRequest_00895ac8;
  SharedDtor(unaff_retaddr);
  RepeatedPtrField<google::protobuf::FileDescriptorProto>::~RepeatedPtrField(in_RDI);
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)in_RDI);
  internal::InternalMetadataWithArena::~InternalMetadataWithArena
            ((InternalMetadataWithArena *)0x4b1c7e);
  Message::~Message((Message *)0x4b1c88);
  return;
}

Assistant:

CodeGeneratorRequest::~CodeGeneratorRequest() {
  // @@protoc_insertion_point(destructor:google.protobuf.compiler.CodeGeneratorRequest)
  SharedDtor();
}